

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack1to4_int8.h
# Opt level: O1

void ncnn::convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse
               (Mat *_kernel,Mat *kernel_tm,int inch,int outch,int kernel_w,int kernel_h)

{
  int iVar1;
  int _h;
  uint _w;
  int _w_00;
  ulong uVar2;
  void *pvVar3;
  void *pvVar4;
  ulong uVar5;
  int k;
  ulong uVar6;
  int i;
  ulong uVar7;
  int j;
  long lVar8;
  Mat local_78;
  
  _w = kernel_w * kernel_h;
  Mat::reshape(&local_78,_kernel,_w,inch,outch,(Allocator *)0x0);
  if (inch < 4) {
    _w_00 = _w * 4;
    _h = inch;
  }
  else {
    _w_00 = _w * 0x10;
    _h = inch + ((uint)inch >> 2) * -3;
  }
  iVar1 = outch + 3;
  if (-1 < outch) {
    iVar1 = outch;
  }
  Mat::create(kernel_tm,_w_00,_h,iVar1 >> 2,1,(Allocator *)0x0);
  if (3 < outch) {
    uVar2 = 0;
    do {
      pvVar3 = (void *)((uVar2 >> 2) * kernel_tm->cstep * kernel_tm->elemsize +
                       (long)kernel_tm->data);
      if (inch < 4) {
        uVar5 = 0;
      }
      else {
        uVar6 = 0;
        do {
          if (0 < (int)_w) {
            uVar5 = 0;
            do {
              uVar7 = 0;
              do {
                pvVar4 = pvVar3;
                lVar8 = 0;
                do {
                  *(undefined1 *)((long)pvVar4 + lVar8) =
                       *(undefined1 *)
                        ((long)local_78.data +
                        uVar5 + (uVar6 + lVar8) * (long)local_78.w * local_78.elemsize +
                                local_78.cstep * (uVar7 | uVar2) * local_78.elemsize);
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 4);
                uVar7 = uVar7 + 1;
                pvVar3 = (void *)((long)pvVar4 + 4);
              } while (uVar7 != 4);
              uVar5 = uVar5 + 1;
              pvVar3 = (void *)((long)pvVar4 + 4);
            } while (uVar5 != _w);
            pvVar3 = (void *)((long)pvVar4 + 4);
          }
          uVar5 = uVar6 + 4;
          lVar8 = uVar6 + 7;
          uVar6 = uVar5;
        } while (lVar8 < inch);
      }
      if ((int)uVar5 < inch) {
        uVar5 = uVar5 & 0xffffffff;
        do {
          if (0 < (int)_w) {
            uVar6 = 0;
            do {
              pvVar4 = pvVar3;
              lVar8 = 0;
              do {
                *(undefined1 *)((long)pvVar4 + lVar8) =
                     *(undefined1 *)
                      ((long)local_78.data +
                      uVar6 + (long)local_78.w * uVar5 * local_78.elemsize +
                              (uVar2 + lVar8) * local_78.cstep * local_78.elemsize);
                lVar8 = lVar8 + 1;
              } while (lVar8 != 4);
              uVar6 = uVar6 + 1;
              pvVar3 = (void *)((long)pvVar4 + 4);
            } while (uVar6 != _w);
            pvVar3 = (void *)((long)pvVar4 + 4);
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 != (uint)inch);
      }
      uVar5 = uVar2 + 7;
      uVar2 = uVar2 + 4;
    } while (uVar5 < (uint)outch);
  }
  if (local_78.refcount != (int *)0x0) {
    LOCK();
    *local_78.refcount = *local_78.refcount + -1;
    UNLOCK();
    if (*local_78.refcount == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse(const Mat& _kernel, Mat& kernel_tm, int inch, int outch, int kernel_w, int kernel_h)
{
    const int maxk = kernel_w * kernel_h;

    // interleave
    // src = maxk-inch-outch
    // dst = 4a-4b-maxk-inch/4a-outch/4b
    Mat kernel = _kernel.reshape(maxk, inch, outch);
    if (inch >= 4)
        kernel_tm.create(16 * maxk, inch / 4 + inch % 4, outch / 4, (size_t)1u);
    else
        kernel_tm.create(4 * maxk, inch, outch / 4, (size_t)1u);

    for (int q = 0; q + 3 < outch; q += 4)
    {
        signed char* g00 = kernel_tm.channel(q / 4);

        int p = 0;
        for (; p + 3 < inch; p += 4)
        {
            for (int k = 0; k < maxk; k++)
            {
                for (int i = 0; i < 4; i++)
                {
                    for (int j = 0; j < 4; j++)
                    {
                        const signed char* k00 = kernel.channel(q + i).row<const signed char>(p + j);

                        g00[0] = k00[k];

                        g00++;
                    }
                }
            }
        }
        for (; p < inch; p++)
        {
            for (int k = 0; k < maxk; k++)
            {
                for (int i = 0; i < 4; i++)
                {
                    const signed char* k00 = kernel.channel(q + i).row<const signed char>(p);

                    g00[0] = k00[k];

                    g00++;
                }
            }
        }
    }
}